

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_dpll_triad_simd.cc
# Opt level: O0

void anon_unknown.dwarf_12932::SolverDpllTriadSimd<0>::InitClue(char *input,State *state,int pos)

{
  undefined8 *puVar1;
  long lVar2;
  long lVar3;
  int in_EDX;
  long in_RSI;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qb;
  undefined8 in_YMM0_H;
  undefined8 in_register_00001218;
  uint16_t candidate;
  char digit;
  BoxIndexing *indexing;
  undefined6 in_stack_ffffffffffffff40;
  uint16_t in_stack_ffffffffffffff46;
  Bitvec16x16 *in_stack_ffffffffffffff48;
  Bitvec16x16 *in_stack_ffffffffffffff50;
  undefined8 local_a8;
  undefined8 local_90;
  undefined8 local_88;
  
  lVar3 = (long)in_EDX * 6;
  Bitvec16x16::and_not(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  puVar1 = (undefined8 *)
           (in_RSI + 0xc0 + (ulong)(byte)(anonymous_namespace)::tables[lVar3 + 0x1902] * 0x20);
  *puVar1 = extraout_XMM0_Qa;
  puVar1[1] = extraout_XMM0_Qb;
  puVar1[2] = in_YMM0_H;
  puVar1[3] = in_register_00001218;
  Bitvec08x16::All(in_stack_ffffffffffffff46);
  Bitvec08x16::X_Y_and_Z_or
            ((Bitvec08x16 *)in_stack_ffffffffffffff50,(Bitvec08x16 *)in_stack_ffffffffffffff48,
             (Bitvec08x16 *)CONCAT26(in_stack_ffffffffffffff46,in_stack_ffffffffffffff40));
  lVar2 = in_RSI + (ulong)(byte)(anonymous_namespace)::tables[lVar3 + 0x1900] * 0x20;
  *(undefined8 *)(lVar2 + 0x10) = local_90;
  *(undefined8 *)(lVar2 + 0x18) = local_88;
  Bitvec08x16::All(in_stack_ffffffffffffff46);
  Bitvec08x16::X_Y_and_Z_or
            ((Bitvec08x16 *)in_stack_ffffffffffffff50,(Bitvec08x16 *)in_stack_ffffffffffffff48,
             (Bitvec08x16 *)CONCAT26(in_stack_ffffffffffffff46,in_stack_ffffffffffffff40));
  lVar2 = in_RSI + 0x60 + (ulong)(byte)(anonymous_namespace)::tables[lVar3 + 0x1901] * 0x20;
  *(Bitvec16x16 **)(lVar2 + 0x10) = in_stack_ffffffffffffff50;
  *(undefined8 *)(lVar2 + 0x18) = local_a8;
  return;
}

Assistant:

static inline void InitClue(const char *input, State &state, int pos) {
        const BoxIndexing &indexing = tables.box_indexing[pos];
        char digit = input[pos];
        uint16_t candidate = 1u << (uint32_t) (digit - '1');
        // perform eliminations for the clue in its own box, but don't propagate. this is
        // not strictly necessary since band eliminations will constrain the puzzle, but it
        // turns out to be important for performance on invalid zero-solution puzzles.
        state.boxen[indexing.box].cells = state.boxen[indexing.box].cells.and_not(
                tables.cell_assignment_eliminations[digit - '1'][indexing.elem]);
        // merge band eliminations; we'll propagate after all clue are processed.
        state.bands[0][indexing.box_i].eliminations = Cells08::X_Y_and_Z_or(
                tables.peer_x_elem_to_config_mask[indexing.box_j][indexing.elem_i],
                Cells08::All(candidate),
                state.bands[0][indexing.box_i].eliminations);
        state.bands[1][indexing.box_j].eliminations = Cells08::X_Y_and_Z_or(
                tables.peer_x_elem_to_config_mask[indexing.box_i][indexing.elem_j],
                Cells08::All(candidate),
                state.bands[1][indexing.box_j].eliminations);
    }